

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ImplicitAnsiPortSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ImplicitAnsiPortSyntax *this,size_t index)

{
  SyntaxNode *node;
  DeclaratorSyntax *node_00;
  SyntaxNode *local_40;
  size_t index_local;
  ImplicitAnsiPortSyntax *this_local;
  
  if (index == 0) {
    local_40 = (SyntaxNode *)0x0;
    if (this != (ImplicitAnsiPortSyntax *)0xfffffffffffffff0) {
      local_40 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_40);
  }
  else if (index == 1) {
    node = &not_null<slang::syntax::PortHeaderSyntax_*>::get(&this->header)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 2) {
    node_00 = not_null<slang::syntax::DeclaratorSyntax_*>::get(&this->declarator);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node_00->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ImplicitAnsiPortSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return header.get();
        case 2: return declarator.get();
        default: return nullptr;
    }
}